

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containersNative.cpp
# Opt level: O1

PackageInfo * chatra::emb::containers::packageInfo(void)

{
  char *pcVar1;
  char *pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  PackageInfo *in_RDI;
  long lVar4;
  undefined1 *puVar5;
  initializer_list<chatra::Script> __l;
  initializer_list<chatra::NativeCallHandlerInfo> __l_00;
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined4 local_530;
  undefined4 uStack_52c;
  undefined1 local_528 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_518;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_508;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  code *local_4e8;
  undefined8 local_4e0;
  undefined8 local_4d8;
  uint local_4d0 [2];
  undefined4 uStack_4c8;
  undefined4 uStack_4c4;
  uint *local_4c0;
  undefined8 local_4b8;
  uint local_4b0 [2];
  undefined4 uStack_4a8;
  undefined4 uStack_4a4;
  undefined1 *local_4a0;
  undefined8 local_498;
  undefined1 local_490 [16];
  code *local_480;
  uint *local_478;
  undefined8 local_470;
  uint local_468 [2];
  undefined4 uStack_460;
  undefined4 uStack_45c;
  uint *local_458;
  undefined8 local_450;
  uint local_448 [2];
  undefined4 uStack_440;
  undefined4 uStack_43c;
  undefined1 *local_438;
  undefined8 local_430;
  undefined1 local_428 [16];
  code *local_418;
  uint *local_410;
  undefined8 local_408;
  uint local_400 [2];
  undefined4 uStack_3f8;
  undefined4 uStack_3f4;
  uint *local_3f0;
  undefined8 local_3e8;
  uint local_3e0 [2];
  undefined4 uStack_3d8;
  undefined4 uStack_3d4;
  undefined1 *local_3d0;
  undefined8 local_3c8;
  undefined1 local_3c0 [16];
  code *local_3b0;
  uint *local_3a8;
  undefined8 local_3a0;
  uint local_398 [2];
  undefined4 uStack_390;
  undefined4 uStack_38c;
  uint *local_388;
  undefined8 local_380;
  uint local_378 [2];
  undefined4 uStack_370;
  undefined4 uStack_36c;
  undefined1 *local_368;
  undefined8 local_360;
  undefined1 local_358 [16];
  code *local_348;
  uint *local_340;
  undefined8 local_338;
  uint local_330 [2];
  undefined4 uStack_328;
  undefined4 uStack_324;
  char *local_320;
  size_type local_318;
  char local_310 [8];
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined1 *local_300;
  undefined8 local_2f8;
  undefined1 local_2f0 [16];
  code *local_2e0;
  char *local_2d8;
  size_type local_2d0;
  char local_2c8 [8];
  undefined8 uStack_2c0;
  undefined1 *local_2b8;
  undefined8 local_2b0;
  undefined1 local_2a8 [8];
  undefined8 uStack_2a0;
  undefined1 *local_298;
  undefined8 local_290;
  undefined1 local_288 [16];
  undefined1 local_278 [8];
  vector<chatra::Script,_std::allocator<chatra::Script>_> scripts;
  vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_> handlers;
  undefined1 local_238 [16];
  char *local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  _Alloc_hider _Stack_210;
  char *local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  char *local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  undefined8 uStack_1d0;
  undefined1 *local_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8 [8];
  undefined8 uStack_1b0;
  uint *local_1a8;
  NativeCallHandler local_1a0;
  uint local_198 [2];
  undefined4 uStack_190;
  undefined4 uStack_18c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_188;
  undefined8 local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  uint *local_168;
  undefined8 local_160;
  uint local_158 [2];
  undefined4 uStack_150;
  undefined4 uStack_14c;
  uint *local_148;
  undefined8 local_140;
  uint local_138 [2];
  undefined4 uStack_130;
  undefined4 uStack_12c;
  uint *local_128;
  undefined8 local_120;
  uint local_118 [2];
  undefined4 uStack_110;
  undefined4 uStack_10c;
  uint *local_108;
  undefined8 local_100;
  uint local_f8 [2];
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  PackageInfo *local_e8;
  uint *local_e0;
  undefined8 local_d8;
  uint local_d0 [2];
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  uint *local_c0;
  undefined8 local_b8;
  uint local_b0 [2];
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  uint *local_a0;
  undefined8 local_98;
  uint local_90 [2];
  undefined4 uStack_88;
  undefined4 uStack_84;
  uint *local_80;
  undefined8 local_78;
  uint local_70 [2];
  undefined4 uStack_68;
  undefined4 uStack_64;
  uint *local_60;
  undefined8 local_58;
  uint local_50 [2];
  undefined4 uStack_48;
  undefined4 uStack_44;
  allocator_type local_39 [9];
  
  handlers.
  super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_238;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &handlers.
              super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"containers","");
  pcVar1 = local_220._M_local_buf + 8;
  local_228 = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_228,
             "\n/*\n * Programming language \'Chatra\' reference implementation\n *\n * Copyright(C) 2019-2020 Chatra Project Team\n *\n * Licensed under the Apache License, Version 2.0 (the \"License\");\n * you may not use this file except in compliance with the License.\n * You may obtain a copy of the License at\n *\n *   http://www.apache.org/licenses/LICENSE-2.0\n *\n * Unless required by applicable law or agreed to in writing, software\n * distributed under the License is distributed on an \"AS IS\" BASIS,\n * WITHOUT WARRANTIES OR CONDITIONS OF ANY KIND, either express or implied.\n * See the License for the specific language governing permissions and\n * limitations under the License.\n *\n * author: Satoshi Hosokawa (chatra.hosokawa@gmail.com)\n */\n\nclass ByteArray extends VariableLengthSequence\n\tdef _init_instance() as native\n\tdef _init_instance(value) as native\n\n\tdef init()\n\t\tsuper()\n\t\t_init_instance()\n\n\tdef init(value: String)\n\t\tsuper()\n\t\t_init_instance(value)\n\n\tdef init(value: ByteArray)\n\t\tsuper()\n\t\t_init_instance(value)\n\n\tdef size() as native\n\n\tdef _native_resize(a0) as native\n\n\tdef resize(newSize: Int)\n\t\t_native_resize(newSize)\n\t\treturn self\n\n\tdef has(value)\n\t\tt0 = size()\n\t\tt1 = 0\n\t\twhile t1 < t0\n\t\t\tif _native_at(t1++) == value\n\t\t\t\treturn true\n\t\treturn false\n\n\tdef _native_add(a0) as native\n\n\tdef add(a0...;)\n\t\tt0 = a0.size()\n\t\tt1 = 0\n\t\twhile t1 < t0\n\t\t\t_native_add(a0[t1++])\n\t\treturn self\n\n\tdef add(a0)\n\t\t_native_add(a0)\n\t\treturn self\n\n\tdef append(a0)\n\t\tif a0 == null\n\t\t\treturn self\n\t\tfor t0 in a0\n\t\t\tadd(t0)\n\t\treturn self\n\n\tdef _native_insert(a0, a1) as native\n\n\tdef insert(position: Int, a0...;)\n\t\tt0 = a0.size()\n\t\tt1 = 0\n\t\twhile t1 < t0\n\t\t\t_native_insert(position + t1, a0[t1])\n\t\t\tt1++\n\t\treturn self\n\n\tdef insert(position: Int, a0)\n\t\t_native_insert(position, a0)\n\t\treturn self\n\n\tdef _native_at(a0) as native\n\n\tdef (position: Int)\n\t\treturn _native_at(position)\n\n\tdef _native_at(a0, a1) as native\n\n\tdef (position: Int).set(r)\n\t\treturn _native_at(position, r)\n\n\tdef remove(position: Int) as native\n\n\tdef remove(a0: IndexSet)\n\t\tt0 = Array()\n\t\tif a0.fi..." /* TRUNCATED STRING LITERAL */
             ,"");
  if (handlers.
      super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)local_238) {
    local_540._8_8_ = local_238._8_8_;
    local_550._0_8_ = (pointer)local_540;
  }
  else {
    local_550._0_8_ =
         handlers.
         super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  local_238[0] = 0;
  if (local_228 == pcVar1) {
    aStack_518._0_8_ = _Stack_210._M_p;
    _local_530 = local_528 + 8;
  }
  else {
    _local_530 = local_228;
  }
  local_528._0_8_ = local_220._M_allocated_capacity;
  local_220._M_allocated_capacity = 0;
  local_220._M_local_buf[8] = '\0';
  __l._M_len = 1;
  __l._M_array = (iterator)local_550;
  handlers.
  super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_238;
  local_228 = pcVar1;
  local_e8 = in_RDI;
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::vector
            ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_278,__l,
             (allocator_type *)
             &scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if ((undefined1 *)_local_530 != local_528 + 8) {
    operator_delete((void *)_local_530);
  }
  if ((pointer)local_550._0_8_ != (pointer)local_540) {
    operator_delete((void *)local_550._0_8_);
  }
  if (local_228 != pcVar1) {
    operator_delete(local_228);
  }
  if (handlers.
      super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)local_238) {
    operator_delete(handlers.
                    super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  local_1a8 = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"ByteArray","");
  local_188 = &local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"_init_instance","");
  local_550._8_8_ = local_540 + 8;
  local_550._0_8_ = byteArray_initInstance;
  if (local_1a8 == local_198) {
    uStack_52c = uStack_18c;
    local_530 = uStack_190;
  }
  else {
    local_550._8_8_ = local_1a8;
  }
  local_528._0_8_ = &aStack_518;
  local_540._0_8_ = local_1a0;
  local_1a0 = (NativeCallHandler)0x0;
  local_198[0] = local_198[0] & 0xffffff00;
  if (local_188 == &local_178) {
    aStack_518._8_4_ = local_178._8_4_;
    aStack_518._12_4_ = local_178._12_4_;
  }
  else {
    local_528._0_8_ = local_188;
  }
  local_508._M_allocated_capacity = (size_type)&local_4f8;
  local_528._8_8_ = local_180;
  local_180 = 0;
  local_178._M_allocated_capacity._0_4_ = local_178._M_allocated_capacity._0_4_ & 0xffffff00;
  local_508._8_8_ = 0;
  local_4f8._M_local_buf[0] = '\0';
  local_1a8 = local_198;
  local_188 = &local_178;
  local_168 = local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"ByteArray","");
  local_c0 = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"size","");
  local_4e0 = local_4d0;
  local_4e8 = byteArray_size;
  if (local_168 == local_158) {
    uStack_4c8 = uStack_150;
    uStack_4c4 = uStack_14c;
  }
  else {
    local_4e0 = local_168;
  }
  local_4c0 = local_4b0;
  local_4d8 = local_160;
  local_160 = 0;
  local_158[0] = local_158[0] & 0xffffff00;
  if (local_c0 == local_b0) {
    uStack_4a8 = uStack_a8;
    uStack_4a4 = uStack_a4;
  }
  else {
    local_4c0 = local_c0;
  }
  local_4a0 = local_490;
  local_4b8 = local_b8;
  local_b8 = 0;
  local_b0[0] = local_b0[0] & 0xffffff00;
  local_498 = 0;
  local_490[0] = 0;
  local_168 = local_158;
  local_148 = local_138;
  local_c0 = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"ByteArray","");
  local_a0 = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"_native_resize","");
  local_478 = local_468;
  local_480 = byteArray_resize;
  if (local_148 == local_138) {
    uStack_460 = uStack_130;
    uStack_45c = uStack_12c;
  }
  else {
    local_478 = local_148;
  }
  local_458 = local_448;
  local_470 = local_140;
  local_140 = 0;
  local_138[0] = local_138[0] & 0xffffff00;
  if (local_a0 == local_90) {
    uStack_440 = uStack_88;
    uStack_43c = uStack_84;
  }
  else {
    local_458 = local_a0;
  }
  local_438 = local_428;
  local_450 = local_98;
  local_98 = 0;
  local_90[0] = local_90[0] & 0xffffff00;
  local_430 = 0;
  local_428[0] = 0;
  local_148 = local_138;
  local_128 = local_118;
  local_a0 = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"ByteArray","");
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"_native_add","");
  local_410 = local_400;
  local_418 = byteArray_add;
  if (local_128 == local_118) {
    uStack_3f8 = uStack_110;
    uStack_3f4 = uStack_10c;
  }
  else {
    local_410 = local_128;
  }
  local_3f0 = local_3e0;
  local_408 = local_120;
  local_120 = 0;
  local_118[0] = local_118[0] & 0xffffff00;
  if (local_80 == local_70) {
    uStack_3d8 = uStack_68;
    uStack_3d4 = uStack_64;
  }
  else {
    local_3f0 = local_80;
  }
  local_3d0 = local_3c0;
  local_3e8 = local_78;
  local_78 = 0;
  local_70[0] = local_70[0] & 0xffffff00;
  local_3c8 = 0;
  local_3c0[0] = 0;
  local_128 = local_118;
  local_108 = local_f8;
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"ByteArray","");
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"_native_insert","");
  local_3a8 = local_398;
  local_3b0 = byteArray_insert;
  if (local_108 == local_f8) {
    uStack_390 = uStack_f0;
    uStack_38c = uStack_ec;
  }
  else {
    local_3a8 = local_108;
  }
  local_388 = local_378;
  local_3a0 = local_100;
  local_100 = 0;
  local_f8[0] = local_f8[0] & 0xffffff00;
  if (local_60 == local_50) {
    uStack_370 = uStack_48;
    uStack_36c = uStack_44;
  }
  else {
    local_388 = local_60;
  }
  local_368 = local_358;
  local_380 = local_58;
  local_58 = 0;
  local_50[0] = local_50[0] & 0xffffff00;
  local_360 = 0;
  local_358[0] = 0;
  local_e0 = local_d0;
  local_108 = local_f8;
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"ByteArray","");
  pcVar1 = local_200._M_local_buf + 8;
  local_208 = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"_native_at","");
  local_340 = local_330;
  local_348 = byteArray_at;
  if (local_e0 == local_d0) {
    uStack_328 = uStack_c8;
    uStack_324 = uStack_c4;
  }
  else {
    local_340 = local_e0;
  }
  local_320 = local_310;
  local_338 = local_d8;
  local_d8 = 0;
  local_d0[0] = local_d0[0] & 0xffffff00;
  if (local_208 == pcVar1) {
    uStack_308 = uStack_1f0;
    uStack_304 = uStack_1ec;
  }
  else {
    local_320 = local_208;
  }
  local_300 = local_2f0;
  local_318 = local_200._M_allocated_capacity;
  local_200._M_allocated_capacity = 0;
  local_200._8_4_ = local_200._8_4_ & 0xffffff00;
  local_2f8 = 0;
  local_2f0[0] = 0;
  pcVar2 = local_1e0._M_local_buf + 8;
  local_208 = pcVar1;
  local_1e8 = pcVar2;
  local_e0 = local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"ByteArray","");
  local_1c8 = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"remove","");
  local_2d8 = local_2c8;
  local_2e0 = byteArray_remove;
  if (local_1e8 == pcVar2) {
    uStack_2c0 = uStack_1d0;
  }
  else {
    local_2d8 = local_1e8;
  }
  local_2b8 = local_2a8;
  local_2d0 = local_1e0._M_allocated_capacity;
  local_1e0._M_allocated_capacity = 0;
  local_1e0._M_local_buf[8] = '\0';
  if (local_1c8 == local_1b8) {
    uStack_2a0 = uStack_1b0;
  }
  else {
    local_2b8 = local_1c8;
  }
  puVar5 = local_288;
  local_2b0 = local_1c0;
  local_1c0 = 0;
  local_1b8[0] = 0;
  local_290 = 0;
  local_288[0] = 0;
  __l_00._M_len = 7;
  __l_00._M_array = (iterator)local_550;
  local_298 = puVar5;
  local_1e8 = pcVar2;
  local_1c8 = local_1b8;
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::vector
            ((vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
              *)&scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage,__l_00,local_39);
  lVar4 = -0x2d8;
  do {
    if (puVar5 != *(undefined1 **)(puVar5 + -0x10)) {
      operator_delete(*(undefined1 **)(puVar5 + -0x10));
    }
    if (puVar5 + -0x20 != *(undefined1 **)(puVar5 + -0x30)) {
      operator_delete(*(undefined1 **)(puVar5 + -0x30));
    }
    if (puVar5 + -0x40 != *(undefined1 **)(puVar5 + -0x50)) {
      operator_delete(*(undefined1 **)(puVar5 + -0x50));
    }
    puVar5 = puVar5 + -0x68;
    lVar4 = lVar4 + 0x68;
  } while (lVar4 != 0);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  if (local_1e8 != pcVar2) {
    operator_delete(local_1e8);
  }
  if (local_208 != pcVar1) {
    operator_delete(local_208);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0);
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  if (local_108 != local_f8) {
    operator_delete(local_108);
  }
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  if (local_128 != local_118) {
    operator_delete(local_128);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  if (local_148 != local_138) {
    operator_delete(local_148);
  }
  if (local_c0 != local_b0) {
    operator_delete(local_c0);
  }
  if (local_168 != local_158) {
    operator_delete(local_168);
  }
  if (local_188 != &local_178) {
    operator_delete(local_188);
  }
  if (local_1a8 != local_198) {
    operator_delete(local_1a8);
  }
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::vector
            (&local_e8->scripts,(vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_278
            );
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::vector
            (&local_e8->handlers,
             (vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
              *)&scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage);
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var3->_M_use_count = 1;
  p_Var3->_M_weak_count = 1;
  p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0024a980;
  p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR__IPackage_0024a9d0;
  (local_e8->interface).super___shared_ptr<chatra::IPackage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var3 + 1);
  (local_e8->interface).super___shared_ptr<chatra::IPackage,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = p_Var3;
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::
  ~vector((vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_> *)
          &scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage);
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::~vector
            ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_278);
  return local_e8;
}

Assistant:

PackageInfo packageInfo() {
	std::vector<Script> scripts = {{"containers", script}};
	std::vector<HandlerInfo> handlers = {
			{byteArray_initInstance, "ByteArray", "_init_instance"},
			{byteArray_size, "ByteArray", "size"},
			{byteArray_resize, "ByteArray", "_native_resize"},
			{byteArray_add, "ByteArray", "_native_add"},
			{byteArray_insert, "ByteArray", "_native_insert"},
			{byteArray_at, "ByteArray", "_native_at"},
			{byteArray_remove, "ByteArray", "remove"},
	};
	return {scripts, handlers, std::make_shared<ContainersPackageInterface>()};
}